

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

vec<unsigned_int> * __thiscall
Minisat::OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::lookup
          (OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *this,
          int *idx)

{
  int iVar1;
  char *pcVar2;
  vec<unsigned_int> *pvVar3;
  Var *in_RSI;
  vec<Minisat::vec<unsigned_int>_> *in_RDI;
  int *in_stack_00000008;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *in_stack_00000010;
  
  iVar1 = toInt(*in_RSI);
  pcVar2 = vec<char>::operator[]((vec<char> *)(in_RDI + 1),iVar1);
  if (*pcVar2 != '\0') {
    clean(in_stack_00000010,in_stack_00000008);
  }
  iVar1 = toInt(*in_RSI);
  pvVar3 = vec<Minisat::vec<unsigned_int>_>::operator[](in_RDI,iVar1);
  return pvVar3;
}

Assistant:

Vec &lookup(const Idx &idx)
    {
        if (dirty[toInt(idx)]) clean(idx);
        return occs[toInt(idx)];
    }